

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRoutersInDomain
          (Registry *this,string *aDomainName)

{
  pointer *this_00;
  PersistentStorage *pPVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  string local_190;
  reference local_170;
  unsigned_long *xpan;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_148 [8];
  Domain currentDomain;
  StringArray aUnresolved;
  StringArray aAliases;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  undefined1 local_c8 [8];
  Network current;
  undefined1 local_60 [7];
  Status status;
  DomainArray doms;
  Domain dom;
  string *aDomainName_local;
  Registry *this_local;
  
  dom.mName.field_2._8_8_ = aDomainName;
  Domain::Domain((Domain *)
                 &doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            *)local_60);
  Network::Network((Network *)local_c8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &aAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&aUnresolved.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&currentDomain.mName.field_2 + 8));
  std::__cxx11::string::operator=((string *)&dom,(string *)dom.mName.field_2._8_8_);
  iVar4 = (*this->mStorage->_vptr_PersistentStorage[0x15])
                    (this->mStorage,
                     &doms.
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_60);
  current._95_1_ = anon_unknown_0::MapStatus((Status)iVar4);
  if (current._95_1_ == kSuccess) {
    sVar5 = std::
            vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ::size((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                    *)local_60);
    if (sVar5 == 1) {
      current._95_1_ = GetCurrentNetwork(this,(Network *)local_c8);
      if (current._95_1_ == kSuccess) {
        uVar2 = 0;
        if (local_c8._4_4_ != 0xffffffff) {
          Domain::Domain((Domain *)local_148);
          iVar4 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                            (this->mStorage,local_c8 + 4,local_148);
          current._95_1_ = anon_unknown_0::MapStatus((Status)iVar4);
          if (current._95_1_ == kSuccess) {
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&currentDomain,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)dom.mName.field_2._8_8_);
            if (bVar3) {
              bVar3 = false;
            }
            else {
              current._95_1_ = 5;
              bVar3 = true;
            }
          }
          else {
            bVar3 = true;
          }
          Domain::~Domain((Domain *)local_148);
          uVar2 = current._95_1_;
          if (bVar3) {
            if (!bVar3) goto LAB_0022e00a;
            goto LAB_0022dffa;
          }
        }
        current._95_1_ = uVar2;
        current._95_1_ =
             GetNetworkXpansInDomain
                       (this,(string *)dom.mName.field_2._8_8_,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &aAliases.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (current._95_1_ == kSuccess) {
          bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &aAliases.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar3) {
            pPVar1 = this->mStorage;
            pvVar6 = std::
                     vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                     ::operator[]((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                   *)local_60,0);
            iVar4 = (*pPVar1->_vptr_PersistentStorage[9])(pPVar1,pvVar6);
            current._95_1_ = anon_unknown_0::MapStatus((Status)iVar4);
          }
          else {
            this_00 = &aAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
            xpan = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                               *)&xpan), bVar3) {
              local_170 = __gnu_cxx::
                          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ::operator*(&__end2);
              utils::Hex<unsigned_long>(&local_190,*local_170);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&aUnresolved.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_190);
              std::__cxx11::string::~string((string *)&local_190);
              __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator++(&__end2);
            }
            current._95_1_ =
                 DeleteBorderRoutersInNetworks
                           (this,(StringArray *)
                                 &aUnresolved.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (StringArray *)((long)&currentDomain.mName.field_2 + 8));
            if ((current._95_1_ == kSuccess) &&
               (bVar3 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&currentDomain.mName.field_2 + 8)), !bVar3)) {
              current._95_1_ = 3;
            }
          }
        }
      }
    }
    else {
      current._95_1_ = 4;
    }
  }
LAB_0022dffa:
  this_local._7_1_ = current._95_1_;
LAB_0022e00a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&currentDomain.mName.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&aUnresolved.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &aAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Network::~Network((Network *)local_c8);
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
             *)local_60);
  Domain::~Domain((Domain *)
                  &doms.
                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

Registry::Status Registry::DeleteBorderRoutersInDomain(const std::string &aDomainName)
{
    Domain                dom;
    DomainArray           doms;
    Registry::Status      status;
    Network               current;
    std::vector<uint64_t> xpans;
    StringArray           aAliases;
    StringArray           aUnresolved;

    dom.mName = aDomainName;
    VerifyOrExit((status = MapStatus(mStorage->Lookup(dom, doms))) == Registry::Status::kSuccess);
    VerifyOrExit(doms.size() == 1, status = Registry::Status::kError);

    VerifyOrExit((status = GetCurrentNetwork(current)) == Registry::Status::kSuccess);
    if (current.mDomainId.mId != EMPTY_ID)
    {
        Domain currentDomain;
        VerifyOrExit((status = MapStatus(mStorage->Get(current.mDomainId, currentDomain))) ==
                     Registry::Status::kSuccess);
        VerifyOrExit(currentDomain.mName != aDomainName, status = Registry::Status::kRestricted);
    }

    VerifyOrExit((status = GetNetworkXpansInDomain(aDomainName, xpans)) == Registry::Status::kSuccess);
    VerifyOrExit(!xpans.empty(), status = MapStatus(mStorage->Del(doms[0].mId)));

    for (auto &&xpan : xpans)
    {
        aAliases.push_back(utils::Hex(xpan));
    }
    VerifyOrExit((status = DeleteBorderRoutersInNetworks(aAliases, aUnresolved)) == Registry::Status::kSuccess);
    VerifyOrExit(aUnresolved.empty(), status = Registry::Status::kAmbiguity);
    // Domain will be deleted
exit:
    return status;
}